

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O0

whisper_context *
whisper_init_with_params_no_state(whisper_model_loader *loader,whisper_context_params params)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 *in_RDI;
  byte in_stack_00000008;
  byte in_stack_00000009;
  uint in_stack_0000000c;
  byte in_stack_00000010;
  whisper_context *ctx;
  whisper_context *in_stack_00000990;
  whisper_model_loader *in_stack_00000998;
  whisper_context *in_stack_ffffffffffffffd0;
  whisper_context *local_8;
  
  ggml_time_init();
  if (((in_stack_00000009 & 1) != 0) && ((in_stack_00000010 & 1) != 0)) {
    whisper_log_internal
              (GGML_LOG_LEVEL_WARN,
               "%s: dtw_token_timestamps is not supported with flash_attn - disabling\n",
               "whisper_init_with_params_no_state");
    in_stack_00000010 = 0;
  }
  whisper_log_internal
            (GGML_LOG_LEVEL_INFO,"%s: use gpu    = %d\n","whisper_init_with_params_no_state",
             (ulong)(in_stack_00000008 & 1));
  whisper_log_internal
            (GGML_LOG_LEVEL_INFO,"%s: flash attn = %d\n","whisper_init_with_params_no_state",
             (ulong)(in_stack_00000009 & 1));
  whisper_log_internal
            (GGML_LOG_LEVEL_INFO,"%s: gpu_device = %d\n","whisper_init_with_params_no_state",
             (ulong)in_stack_0000000c);
  whisper_log_internal
            (GGML_LOG_LEVEL_INFO,"%s: dtw        = %d\n","whisper_init_with_params_no_state",
             (ulong)(in_stack_00000010 & 1));
  uVar2 = ggml_backend_dev_count();
  whisper_log_internal
            (GGML_LOG_LEVEL_INFO,"%s: devices    = %zu\n","whisper_init_with_params_no_state",uVar2)
  ;
  uVar2 = ggml_backend_reg_count();
  whisper_log_internal
            (GGML_LOG_LEVEL_INFO,"%s: backends   = %zu\n","whisper_init_with_params_no_state",uVar2)
  ;
  local_8 = (whisper_context *)operator_new(0x248);
  whisper_context::whisper_context(in_stack_ffffffffffffffd0);
  memcpy(&local_8->params,&stack0x00000008,0x30);
  bVar1 = whisper_model_load(in_stack_00000998,in_stack_00000990);
  if (bVar1) {
    (*(code *)in_RDI[3])(*in_RDI);
  }
  else {
    (*(code *)in_RDI[3])(*in_RDI);
    whisper_log_internal
              (GGML_LOG_LEVEL_ERROR,"%s: failed to load model\n","whisper_init_with_params_no_state"
              );
    if (local_8 != (whisper_context *)0x0) {
      whisper_context::~whisper_context(local_8);
      operator_delete(local_8,0x248);
    }
    local_8 = (whisper_context *)0x0;
  }
  return local_8;
}

Assistant:

struct whisper_context * whisper_init_with_params_no_state(struct whisper_model_loader * loader, struct whisper_context_params params) {
    ggml_time_init();

    if (params.flash_attn && params.dtw_token_timestamps) {
        WHISPER_LOG_WARN("%s: dtw_token_timestamps is not supported with flash_attn - disabling\n", __func__);
        params.dtw_token_timestamps = false;
    }

    WHISPER_LOG_INFO("%s: use gpu    = %d\n", __func__, params.use_gpu);
    WHISPER_LOG_INFO("%s: flash attn = %d\n", __func__, params.flash_attn);
    WHISPER_LOG_INFO("%s: gpu_device = %d\n", __func__, params.gpu_device);
    WHISPER_LOG_INFO("%s: dtw        = %d\n", __func__, params.dtw_token_timestamps);
    WHISPER_LOG_INFO("%s: devices    = %zu\n", __func__, ggml_backend_dev_count());
    WHISPER_LOG_INFO("%s: backends   = %zu\n", __func__, ggml_backend_reg_count());

    whisper_context * ctx = new whisper_context;
    ctx->params = params;

    if (!whisper_model_load(loader, *ctx)) {
        loader->close(loader->context);
        WHISPER_LOG_ERROR("%s: failed to load model\n", __func__);
        delete ctx;
        return nullptr;
    }

    loader->close(loader->context);

    return ctx;
}